

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::anon_unknown_7::load_png_headers_intern
               (FILE *fp,ImageHeaders *headers,png_structp *png,png_infop *png_info)

{
  ImageType IVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  png_structp ppVar5;
  png_infop ppVar6;
  Exception *pEVar7;
  undefined1 local_58 [8];
  png_byte signature [8];
  allocator local_29;
  
  sVar4 = fread(local_58,1,8,(FILE *)fp);
  if (sVar4 != 8) {
    fclose((FILE *)fp);
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)signature,"PNG signature could not be read",&local_29);
    util::Exception::Exception(pEVar7,(string *)signature);
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  iVar3 = png_sig_cmp(local_58,0,8);
  if (iVar3 != 0) {
    fclose((FILE *)fp);
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)signature,"PNG signature did not match",&local_29);
    util::Exception::Exception(pEVar7,(string *)signature);
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  ppVar5 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
  *png = ppVar5;
  if (ppVar5 == (png_structp)0x0) {
    fclose((FILE *)fp);
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)signature,"Out of memory",&local_29);
    util::Exception::Exception(pEVar7,(string *)signature);
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  ppVar6 = (png_infop)png_create_info_struct(ppVar5);
  *png_info = ppVar6;
  if (ppVar6 != (png_infop)0x0) {
    png_init_io(*png,fp);
    png_set_sig_bytes(*png,8);
    png_read_info(*png,*png_info);
    iVar3 = png_get_image_width(*png,*png_info);
    headers->width = iVar3;
    iVar3 = png_get_image_height(*png,*png_info);
    headers->height = iVar3;
    bVar2 = png_get_channels(*png,*png_info);
    headers->channels = (uint)bVar2;
    bVar2 = png_get_bit_depth(*png,*png_info);
    if (bVar2 < 9) {
      IVar1 = IMAGE_TYPE_UINT8;
    }
    else {
      if (bVar2 != 0x10) {
        png_destroy_read_struct(png,png_info,0);
        fclose((FILE *)fp);
        pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)signature,"PNG with unknown bit depth",&local_29);
        util::Exception::Exception(pEVar7,(string *)signature);
        __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
      }
      IVar1 = IMAGE_TYPE_UINT16;
    }
    headers->type = IVar1;
    return;
  }
  png_destroy_read_struct(png,0,0);
  fclose((FILE *)fp);
  pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)signature,"Out of memory",&local_29);
  util::Exception::Exception(pEVar7,(string *)signature);
  __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
    load_png_headers_intern (FILE* fp, ImageHeaders* headers,
        png_structp* png, png_infop* png_info)
    {
        /* Identify the PNG signature. */
        png_byte signature[8];
        if (std::fread(signature, 1, 8, fp) != 8)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature could not be read");
        }
        if (png_sig_cmp(signature, 0, 8) != 0)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature did not match");
        }

        /* Initialize PNG structures. */
        *png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
            nullptr, nullptr, nullptr);
        if (!*png)
        {
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        *png_info = png_create_info_struct(*png);
        if (!*png_info)
        {
            png_destroy_read_struct(png, nullptr, nullptr);
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        /* Init PNG file IO */
        png_init_io(*png, fp);
        png_set_sig_bytes(*png, 8);

        /* Read PNG header info. */
        png_read_info(*png, *png_info);

        headers->width = png_get_image_width(*png, *png_info);
        headers->height = png_get_image_height(*png, *png_info);
        headers->channels = png_get_channels(*png, *png_info);

        int const bit_depth = png_get_bit_depth(*png, *png_info);
        if (bit_depth <= 8)
            headers->type = IMAGE_TYPE_UINT8;
        else if (bit_depth == 16)
            headers->type = IMAGE_TYPE_UINT16;
        else
        {
            png_destroy_read_struct(png, png_info, nullptr);
            std::fclose(fp);
            throw util::Exception("PNG with unknown bit depth");
        }
    }